

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MapTest_StaticTypeKindWorks_Test::TestBody
          (MapTest_StaticTypeKindWorks_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_160;
  Message local_158;
  TypeKind local_14a [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar_7;
  Message local_130;
  TypeKind local_122 [2];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_6;
  Message local_108;
  TypeKind local_fa [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_5;
  Message local_e0;
  TypeKind local_d2 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_4;
  Message local_b8;
  TypeKind local_aa [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  TypeKind local_82 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  TypeKind local_5a [2];
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_30;
  TypeKind local_22 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  MapTest_StaticTypeKindWorks_Test *this_local;
  
  local_22[1] = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_22[0] = UntypedMapBase::StaticTypeKind<bool>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_20,"UMB::TypeKind::kBool","UMB::StaticTypeKind<bool>()",local_22 + 1,
             local_22);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_5a[1] = 1;
  local_5a[0] = UntypedMapBase::StaticTypeKind<int>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_58,"UMB::TypeKind::kU32","UMB::StaticTypeKind<int32_t>()",
             local_5a + 1,local_5a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_82[1] = 1;
  local_82[0] = UntypedMapBase::StaticTypeKind<unsigned_int>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_80,"UMB::TypeKind::kU32","UMB::StaticTypeKind<uint32_t>()",
             local_82 + 1,local_82);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x144,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_aa[1] = 1;
  local_aa[0] = UntypedMapBase::StaticTypeKind<proto2_unittest::TestAllTypes_NestedEnum>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_a8,"UMB::TypeKind::kU32","UMB::StaticTypeKind<SomeEnum>()",
             local_aa + 1,local_aa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d2[1] = 2;
  local_d2[0] = UntypedMapBase::StaticTypeKind<long>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_d0,"UMB::TypeKind::kU64","UMB::StaticTypeKind<int64_t>()",
             local_d2 + 1,local_d2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_fa[1] = 2;
  local_fa[0] = UntypedMapBase::StaticTypeKind<unsigned_long>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_f8,"UMB::TypeKind::kU64","UMB::StaticTypeKind<uint64_t>()",
             local_fa + 1,local_fa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_122[1] = 5;
  local_122[0] = UntypedMapBase::StaticTypeKind<std::__cxx11::string>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_120,"UMB::TypeKind::kString","UMB::StaticTypeKind<std::string>()",
             local_122 + 1,local_122);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_14a[1] = 6;
  local_14a[0] = UntypedMapBase::StaticTypeKind<proto2_unittest::TestAllTypes>();
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::UntypedMapBase::TypeKind,_google::protobuf::internal::UntypedMapBase::TypeKind,_nullptr>
            ((EqHelper *)local_148,"UMB::TypeKind::kMessage",
             "UMB::StaticTypeKind<proto2_unittest::TestAllTypes>()",local_14a + 1,local_14a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  return;
}

Assistant:

TEST(MapTest, StaticTypeKindWorks) {
  using UMB = UntypedMapBase;
  EXPECT_EQ(UMB::TypeKind::kBool, UMB::StaticTypeKind<bool>());
  EXPECT_EQ(UMB::TypeKind::kU32, UMB::StaticTypeKind<int32_t>());
  EXPECT_EQ(UMB::TypeKind::kU32, UMB::StaticTypeKind<uint32_t>());
  EXPECT_EQ(UMB::TypeKind::kU32, UMB::StaticTypeKind<SomeEnum>());
  EXPECT_EQ(UMB::TypeKind::kU64, UMB::StaticTypeKind<int64_t>());
  EXPECT_EQ(UMB::TypeKind::kU64, UMB::StaticTypeKind<uint64_t>());
  EXPECT_EQ(UMB::TypeKind::kString, UMB::StaticTypeKind<std::string>());
  EXPECT_EQ(UMB::TypeKind::kMessage,
            UMB::StaticTypeKind<proto2_unittest::TestAllTypes>());
}